

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Define.h
# Opt level: O0

Unique<anurbs::Entry<anurbs::BrepEdge>_> __thiscall
anurbs::
new_<anurbs::Entry<anurbs::BrepEdge>,std::__cxx11::string&,std::shared_ptr<anurbs::BrepEdge>&,std::shared_ptr<anurbs::Attributes>&>
          (anurbs *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          shared_ptr<anurbs::BrepEdge> *args_1,shared_ptr<anurbs::Attributes> *args_2)

{
  shared_ptr<anurbs::BrepEdge> *key;
  Entry<anurbs::BrepEdge> *this_00;
  shared_ptr<anurbs::Attributes> local_48;
  shared_ptr<anurbs::BrepEdge> local_38;
  shared_ptr<anurbs::Attributes> *local_28;
  shared_ptr<anurbs::Attributes> *args_local_2;
  shared_ptr<anurbs::BrepEdge> *args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  
  local_28 = args_2;
  args_local_2 = (shared_ptr<anurbs::Attributes> *)args_1;
  args_local_1 = (shared_ptr<anurbs::BrepEdge> *)args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  this_00 = (Entry<anurbs::BrepEdge> *)operator_new(0x48);
  key = args_local_1;
  std::shared_ptr<anurbs::BrepEdge>::shared_ptr
            (&local_38,(shared_ptr<anurbs::BrepEdge> *)args_local_2);
  std::shared_ptr<anurbs::Attributes>::shared_ptr(&local_48,local_28);
  Entry<anurbs::BrepEdge>::Entry(this_00,(string *)key,&local_38,&local_48);
  std::
  unique_ptr<anurbs::Entry<anurbs::BrepEdge>,std::default_delete<anurbs::Entry<anurbs::BrepEdge>>>::
  unique_ptr<std::default_delete<anurbs::Entry<anurbs::BrepEdge>>,void>
            ((unique_ptr<anurbs::Entry<anurbs::BrepEdge>,std::default_delete<anurbs::Entry<anurbs::BrepEdge>>>
              *)this,this_00);
  std::shared_ptr<anurbs::Attributes>::~shared_ptr(&local_48);
  std::shared_ptr<anurbs::BrepEdge>::~shared_ptr(&local_38);
  return (__uniq_ptr_data<anurbs::Entry<anurbs::BrepEdge>,_std::default_delete<anurbs::Entry<anurbs::BrepEdge>_>,_true,_true>
          )(__uniq_ptr_data<anurbs::Entry<anurbs::BrepEdge>,_std::default_delete<anurbs::Entry<anurbs::BrepEdge>_>,_true,_true>
            )this;
}

Assistant:

Unique<T> new_(TArgs&&... args)
{
    return Unique<T>(new T(std::forward<TArgs>(args)...));
}